

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropagatorTest.cpp
# Opt level: O0

string * __thiscall
jaegertracing::propagation::(anonymous_namespace)::
randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen)

{
  char cVar1;
  result_type_conflict rVar2;
  ulong uVar3;
  char *pcVar4;
  unsigned_long pos;
  size_t i;
  allocator local_32;
  undefined1 local_31;
  ulong local_30;
  result_type_conflict size;
  unsigned_long kNumLetters;
  _anonymous_namespace_ *p_Stack_18;
  int kMaxSize;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen_local;
  string *result;
  
  kNumLetters._4_4_ = 10;
  size = 0x3e;
  p_Stack_18 = this;
  gen_local = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
              __return_storage_ptr__;
  rVar2 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)this);
  uVar3 = rVar2 + (rVar2 / 5 & 0xfffffffffffffffe) * -5;
  local_31 = 0;
  local_30 = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,uVar3,'\0',&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  for (pos = 0; pos < local_30; pos = pos + 1) {
    rVar2 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                      ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       p_Stack_18);
    cVar1 = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[rVar2 % 0x3e];
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar4 = cVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string randomStr(RandomGenerator& gen)
{
    constexpr auto kMaxSize = 10;
    static constexpr char kLetters[] =
        "abcdefghijklmnopqrstuvwxyz"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "0123456789";
    constexpr auto kNumLetters = sizeof(kLetters) - 1;
    const auto size = gen() % kMaxSize;
    std::string result(size, '\0');
    for (auto i = static_cast<size_t>(0); i < size; ++i) {
        const auto pos = gen() % kNumLetters;
        result[i] = kLetters[pos];
    }
    return result;
}